

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermediate_code.cpp
# Opt level: O1

LocalAccess * __thiscall FrameMIPS::addParam(FrameMIPS *this,bool escape,int bytesSize)

{
  AccessList *pAVar1;
  LocalAccess *pLVar2;
  Temp *this_00;
  AccessList *pAVar3;
  int iVar4;
  undefined3 in_register_00000031;
  
  if ((CONCAT31(in_register_00000031,escape) == 0) && (bytesSize <= this->regSize)) {
    pLVar2 = (LocalAccess *)operator_new(0x10);
    this_00 = (Temp *)operator_new(0x10);
    Temp::Temp(this_00);
    pLVar2->_vptr_LocalAccess = (_func_int **)&PTR_accessCode_001253a8;
    pLVar2[1]._vptr_LocalAccess = (_func_int **)this_00;
  }
  else {
    iVar4 = bytesSize + this->paramSize;
    this->paramSize = iVar4;
    pLVar2 = (LocalAccess *)operator_new(0x10);
    pLVar2->_vptr_LocalAccess = (_func_int **)&PTR_accessCode_00125380;
    *(int *)&pLVar2[1]._vptr_LocalAccess = iVar4;
  }
  pAVar3 = (AccessList *)operator_new(0x18);
  pAVar1 = this->localData;
  pAVar3->_vptr_AccessList = (_func_int **)&PTR__AccessList_00125360;
  pAVar3->local = pLVar2;
  pAVar3->next = pAVar1;
  this->localData = pAVar3;
  return pLVar2;
}

Assistant:

LocalAccess *FrameMIPS::addParam(bool escape, int bytesSize) {
    if (escape || bytesSize > regSize) {
        paramSize += bytesSize;
        InFrame *inFrame = new InFrame(paramSize);
        this->localData = new AccessList(inFrame, this->localData);
        return inFrame;
    } else {
        InReg *inReg = new InReg(new Temp());
        this->localData = new AccessList(inReg, this->localData);
        return inReg;
    }
}